

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O3

void __thiscall
jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::write
          (ProbabilisticSamplingStrategy *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((ProbabilisticSamplingStrategy *)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)),
        in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t ProbabilisticSamplingStrategy::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ProbabilisticSamplingStrategy");

  xfer += oprot->writeFieldBegin("samplingRate", ::apache::thrift::protocol::T_DOUBLE, 1);
  xfer += oprot->writeDouble(this->samplingRate);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}